

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool cmWhileCommand(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
                   cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  cmMakefile *this_00;
  undefined1 local_78 [16];
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_68;
  cmMakefile *local_60;
  cmMakefile *makefile;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty(args);
  this = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    local_78._0_8_ = this_00;
    local_60 = this_00;
    std::
    make_unique<cmWhileFunctionBlocker,cmMakefile*,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&>
              ((cmMakefile **)(local_78 + 8),
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_78);
    std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
    unique_ptr<cmWhileFunctionBlocker,std::default_delete<cmWhileFunctionBlocker>,void>
              ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_68,
               (unique_ptr<cmWhileFunctionBlocker,_std::default_delete<cmWhileFunctionBlocker>_> *)
               (local_78 + 8));
    cmMakefile::AddFunctionBlocker(this_00,&local_68);
    std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
              (&local_68);
    std::unique_ptr<cmWhileFunctionBlocker,_std::default_delete<cmWhileFunctionBlocker>_>::
    ~unique_ptr((unique_ptr<cmWhileFunctionBlocker,_std::default_delete<cmWhileFunctionBlocker>_> *)
                (local_78 + 8));
  }
  args_local._7_1_ = !bVar1;
  return args_local._7_1_;
}

Assistant:

bool cmWhileCommand(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  auto& makefile = status.GetMakefile();
  makefile.AddFunctionBlocker(
    cm::make_unique<cmWhileFunctionBlocker>(&makefile, args));

  return true;
}